

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::FixedField<(Protocol::MQTT::Common::ControlPacketType)14>::readFrom
          (FixedField<(Protocol::MQTT::Common::ControlPacketType)14> *this,uint8 *buffer,
          uint32 bufLength)

{
  bool bVar1;
  uint32 r;
  uint32 bufLength_local;
  uint8 *buffer_local;
  FixedField<(Protocol::MQTT::Common::ControlPacketType)14> *this_local;
  
  this_local._4_4_ =
       FixedFieldWithReason::readFrom(&this->super_FixedFieldWithReason,buffer,bufLength);
  bVar1 = Common::isError(this_local._4_4_);
  if ((!bVar1) &&
     ((this->super_FixedFieldWithReason).super_FixedFieldWithRemainingLength.remLength == 1)) {
    this_local._4_4_ = 0xfffffffd;
  }
  return this_local._4_4_;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    uint32 r = FixedFieldWithReason::readFrom(buffer, bufLength);
                    if (!isError(r) && remLength == 1) return Shortcut;
                    return r;
                }